

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall QDirPrivate::exists(QDirPrivate *this)

{
  bool bVar1;
  QFlags<QFileSystemMetaData::MetaDataFlag> QVar2;
  QFlags<QAbstractFileEngine::FileFlag> QVar3;
  pointer pQVar4;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  FileFlags info;
  QMutexLocker<QMutex> locker;
  MetaDataFlags in_stack_000000ac;
  FileFlag in_stack_ffffffffffffff9c;
  enum_type in_stack_ffffffffffffffa0;
  enum_type in_stack_ffffffffffffffa4;
  bool local_39;
  undefined4 in_stack_ffffffffffffffd0;
  QFileSystemEntry *entry;
  bool local_19;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_18;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_14;
  int local_10;
  QMutexLocker<QMutex> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  entry = in_RDI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x11610e);
  if (bVar1) {
    local_10 = 0xaaaaaaaa;
    pQVar4 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x1161df);
    local_14.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         operator|(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    QVar3 = QFlags<QAbstractFileEngine::FileFlag>::operator|
                      ((QFlags<QAbstractFileEngine::FileFlag> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
    local_10 = (*pQVar4->_vptr_QAbstractFileEngine[0x16])
                         (pQVar4,(ulong)(uint)QVar3.
                                              super_QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4>
                                              .super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i)
    ;
    local_18.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_19 = QFlags<QAbstractFileEngine::FileFlag>::testAnyFlag
                           ((QFlags<QAbstractFileEngine::FileFlag> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9c);
    }
    else {
      local_19 = false;
    }
  }
  else {
    local_9 = (QMutexLocker<QMutex>)0xaa;
    QMutexLocker<QMutex>::QMutexLocker(&local_9,(QMutex *)&in_RDI[1].m_lastSeparator);
    QVar2 = operator|(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    QFileSystemEngine::fillMetaData
              (entry,(QFileSystemMetaData *)
                     CONCAT44(QVar2.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                              super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i,
                              in_stack_ffffffffffffffd0),in_stack_000000ac);
    bVar1 = QFileSystemMetaData::exists((QFileSystemMetaData *)0x116189);
    local_39 = false;
    if (bVar1) {
      local_39 = QFileSystemMetaData::isDirectory((QFileSystemMetaData *)0x1161aa);
    }
    local_19 = local_39;
    QMutexLocker<QMutex>::~QMutexLocker(&local_9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool QDirPrivate::exists() const
{
    if (!fileEngine) {
        QMutexLocker locker(&fileCache.mutex);
        QFileSystemEngine::fillMetaData(
                dirEntry, fileCache.metaData,
                QFileSystemMetaData::ExistsAttribute
                        | QFileSystemMetaData::DirectoryType); // always stat
        return fileCache.metaData.exists() && fileCache.metaData.isDirectory();
    }
    const QAbstractFileEngine::FileFlags info =
        fileEngine->fileFlags(QAbstractFileEngine::DirectoryType
                                       | QAbstractFileEngine::ExistsFlag
                                       | QAbstractFileEngine::Refresh);
    if (!(info & QAbstractFileEngine::DirectoryType))
        return false;
    return info.testAnyFlag(QAbstractFileEngine::ExistsFlag);
}